

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusservicewatcher.cpp
# Opt level: O3

void __thiscall
QDBusServiceWatcherPrivate::setConnection
          (QDBusServiceWatcherPrivate *this,QStringList *newServices,QDBusConnection *newConnection,
          WatchMode newMode)

{
  QDBusConnection *this_00;
  WatchMode mode;
  bool bVar1;
  long lVar2;
  QString *s;
  QString *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (this->watchedServicesData).super_QPropertyData<QList<QString>_>.val.d.d;
  local_50.ptr = (this->watchedServicesData).super_QPropertyData<QList<QString>_>.val.d.ptr;
  local_50.size = (this->watchedServicesData).super_QPropertyData<QList<QString>_>.val.d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  mode.super_QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>.
  super_QFlagsStorage<QDBusServiceWatcher::WatchModeFlag>.i =
       (QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>)
       (this->watchMode).super_QPropertyData<QFlags<QDBusServiceWatcher::WatchModeFlag>_>.val.
       super_QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>.
       super_QFlagsStorage<QDBusServiceWatcher::WatchModeFlag>.i;
  this_00 = &this->connection;
  bVar1 = QDBusConnection::isConnected(this_00);
  if ((bVar1) && (local_50.size != 0)) {
    lVar2 = local_50.size * 0x18;
    pQVar3 = local_50.ptr;
    do {
      removeService(this,pQVar3,mode);
      pQVar3 = pQVar3 + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  QDBusConnection::operator=(this_00,newConnection);
  (this->watchMode).super_QPropertyData<QFlags<QDBusServiceWatcher::WatchModeFlag>_>.val.
  super_QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>.
  super_QFlagsStorage<QDBusServiceWatcher::WatchModeFlag>.i =
       (Int)newMode.super_QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>.
            super_QFlagsStorage<QDBusServiceWatcher::WatchModeFlag>.i;
  QArrayDataPointer<QString>::operator=
            ((QArrayDataPointer<QString> *)&this->watchedServicesData,&newServices->d);
  bVar1 = QDBusConnection::isConnected(this_00);
  if ((bVar1) && (lVar2 = (newServices->d).size, lVar2 != 0)) {
    pQVar3 = (newServices->d).ptr;
    lVar2 = lVar2 * 0x18;
    do {
      addService(this,pQVar3,newMode);
      pQVar3 = pQVar3 + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusServiceWatcherPrivate::setConnection(const QStringList &newServices,
                                               const QDBusConnection &newConnection,
                                               QDBusServiceWatcher::WatchMode newMode)
{
    const QStringList oldServices = watchedServicesData.valueBypassingBindings();
    const QDBusServiceWatcher::WatchMode oldMode = watchMode.valueBypassingBindings();
    if (connection.isConnected()) {
        // remove older rules
        for (const QString &s : oldServices)
            removeService(s, oldMode);
    }

    connection = newConnection;
    watchMode.setValueBypassingBindings(newMode); // caller has to call notify()
    watchedServicesData.setValueBypassingBindings(newServices); // caller has to call notify()

    if (connection.isConnected()) {
        // add new rules
        for (const QString &s : newServices)
            addService(s, newMode);
    }
}